

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O2

wstring * __thiscall
mjs::(anonymous_namespace)::stringify_state::nest::end_gap_abi_cxx11_
          (wstring *__return_storage_ptr__,void *this)

{
  allocator<wchar_t> local_9;
  
  if (*(long *)(*this + 0x68) == 0) {
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"",&local_9);
  }
  else {
    std::operator+(__return_storage_ptr__,L"\n",
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   ((long)this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring end_gap() const {
            return state_.gap_.empty() ? L"" : L"\n" + step_back_;
        }